

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O2

string * __thiscall gtar::Record::getPath_abi_cxx11_(string *__return_storage_ptr__,Record *this)

{
  ostream *poVar1;
  char *pcVar2;
  string asStack_348 [32];
  stringstream result;
  ostream local_318 [376];
  stringstream fullName;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&fullName);
  std::operator<<(local_190,(string *)&this->m_name);
  if (this->m_resolution != Text) {
    if ((ulong)this->m_format < 7) {
      pcVar2 = &DAT_001903cc + *(int *)(&DAT_001903cc + (ulong)this->m_format * 4);
    }
    else {
      pcVar2 = ".u8";
    }
    std::operator<<(local_190,pcVar2);
    if (this->m_resolution == Uniform) {
      pcVar2 = ".uni";
    }
    else {
      if (this->m_resolution != Individual) goto LAB_0010e7a3;
      pcVar2 = ".ind";
    }
    std::operator<<(local_190,pcVar2);
  }
LAB_0010e7a3:
  std::__cxx11::stringstream::stringstream((stringstream *)&result);
  if ((this->m_group)._M_string_length != 0) {
    poVar1 = std::operator<<(local_318,(string *)this);
    std::operator<<(poVar1,'/');
  }
  if (this->m_behavior == Discrete) {
    poVar1 = std::operator<<(local_318,"frames/");
    poVar1 = std::operator<<(poVar1,(string *)&this->m_index);
    poVar1 = std::operator<<(poVar1,'/');
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar1,asStack_348);
  }
  else if (this->m_behavior == Continuous) {
    poVar1 = std::operator<<(local_318,"vars/");
    std::__cxx11::stringbuf::str();
    poVar1 = std::operator<<(poVar1,asStack_348);
    poVar1 = std::operator<<(poVar1,'/');
    std::operator<<(poVar1,(string *)&this->m_index);
  }
  else {
    std::__cxx11::stringbuf::str();
    std::operator<<(local_318,asStack_348);
  }
  std::__cxx11::string::~string(asStack_348);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&result);
  std::__cxx11::stringstream::~stringstream((stringstream *)&fullName);
  return __return_storage_ptr__;
}

Assistant:

string Record::getPath() const
    {
        stringstream fullName;
        fullName << m_name;

        if(m_resolution != Text)
        {
            switch(m_format)
            {
            case Float32:
                fullName << ".f32";
                break;
            case Float64:
                fullName << ".f64";
                break;
            case Int32:
                fullName << ".i32";
                break;
            case Int64:
                fullName << ".i64";
                break;
            case UInt32:
                fullName << ".u32";
                break;
            case UInt64:
                fullName << ".u64";
                break;
            case UInt8:
            default:
                fullName << ".u8";
            }
        }

        switch(m_resolution)
        {
        case Uniform:
            fullName << ".uni";
            break;
        case Individual:
            fullName << ".ind";
            break;
        case Text:
            // not handled
            break;
        }

        stringstream result;

        if(m_group.size())
            result << m_group << '/';

        switch(m_behavior)
        {
        case Continuous:
            result << "vars/" << fullName.str() << '/' << m_index;
            break;
        case Discrete:
            result << "frames/" << m_index << '/' << fullName.str();
            break;
        case Constant:
        default:
            result << fullName.str();
        }

        return result.str();
    }